

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
ClearNodeVector(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
                *this)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = this->Size;
  if (uVar2 != 0) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      if ((*(long *)((long)this->Nodes + lVar3 + -0x10) != 1) &&
         (plVar1 = *(long **)((long)&this->Nodes->Next + lVar3), plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
        uVar2 = this->Size;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < uVar2);
  }
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}